

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

RegexMatcher * __thiscall
icu_63::RegexMatcher::appendReplacement
          (RegexMatcher *this,UnicodeString *dest,UnicodeString *replacement,UErrorCode *status)

{
  UBool UVar1;
  undefined1 local_148 [8];
  UText resultText;
  UText replacementText;
  UErrorCode *status_local;
  UnicodeString *replacement_local;
  UnicodeString *dest_local;
  RegexMatcher *this_local;
  
  memset(&resultText.privB,0,0x90);
  resultText.privB = 0x345ad82c;
  utext_openConstUnicodeString_63((UText *)&resultText.privB,replacement,status);
  UVar1 = ::U_SUCCESS(*status);
  if (UVar1 != '\0') {
    memset(local_148,0,0x90);
    local_148._0_4_ = 0x345ad82c;
    resultText.flags = 0x90;
    utext_openUnicodeString_63((UText *)local_148,dest,status);
    UVar1 = ::U_SUCCESS(*status);
    if (UVar1 != '\0') {
      appendReplacement(this,(UText *)local_148,(UText *)&resultText.privB,status);
      utext_close_63((UText *)local_148);
    }
    utext_close_63((UText *)&resultText.privB);
  }
  return this;
}

Assistant:

RegexMatcher &RegexMatcher::appendReplacement(UnicodeString &dest,
                                              const UnicodeString &replacement,
                                              UErrorCode &status) {
    UText replacementText = UTEXT_INITIALIZER;

    utext_openConstUnicodeString(&replacementText, &replacement, &status);
    if (U_SUCCESS(status)) {
        UText resultText = UTEXT_INITIALIZER;
        utext_openUnicodeString(&resultText, &dest, &status);

        if (U_SUCCESS(status)) {
            appendReplacement(&resultText, &replacementText, status);
            utext_close(&resultText);
        }
        utext_close(&replacementText);
    }

    return *this;
}